

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O2

void __thiscall Assimp::OptimizeGraphProcess::Execute(OptimizeGraphProcess *this,aiScene *pScene)

{
  LockedSetType *this_00;
  void *__dest;
  uint uVar1;
  aiNode *paVar2;
  pointer puVar3;
  uint uVar4;
  bool bVar5;
  Logger *pLVar6;
  aiNode *this_01;
  aiNode **ppaVar7;
  ostream *this_02;
  DeadlyImportError *this_03;
  uint i;
  ulong uVar8;
  uint a;
  _List_node_base *p_Var9;
  ulong uVar10;
  char *__dest_00;
  list<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  char *local_5d0 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [32];
  
  pLVar6 = DefaultLogger::get();
  Logger::debug(pLVar6,"OptimizeGraphProcess begin");
  this->count_merged = 0;
  this->nodes_in = 0;
  this->nodes_out = 0;
  this->mScene = pScene;
  local_438[0]._M_dataplus._M_p._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->meshes,(ulong)pScene->mNumMeshes,(value_type_conflict3 *)local_438);
  FindInstancedMeshes(this,pScene->mRootNode);
  this_00 = &this->locked;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this_00->_M_t);
  p_Var9 = (_List_node_base *)&this->locked_nodes;
  while (p_Var9 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var9 != (_List_node_base *)&this->locked_nodes) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1));
  }
  for (uVar8 = 0; uVar8 < pScene->mNumAnimations; uVar8 = uVar8 + 1) {
    for (uVar10 = 0; uVar10 < pScene->mAnimations[uVar8]->mNumChannels; uVar10 = uVar10 + 1) {
      std::__cxx11::string::string
                ((string *)local_438,(pScene->mAnimations[uVar8]->mChannels[uVar10]->mNodeName).data
                 ,(allocator *)&local_5b0);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,local_438);
      std::__cxx11::string::~string((string *)local_438);
    }
  }
  for (uVar8 = 0; uVar8 < pScene->mNumMeshes; uVar8 = uVar8 + 1) {
    for (uVar10 = 0; uVar10 < pScene->mMeshes[uVar8]->mNumBones; uVar10 = uVar10 + 1) {
      std::__cxx11::string::string
                ((string *)local_438,(pScene->mMeshes[uVar8]->mBones[uVar10]->mName).data,
                 (allocator *)&local_5b0);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,local_438);
      std::__cxx11::string::~string((string *)local_438);
      puVar3 = (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar8;
      *puVar3 = *puVar3 + 2;
    }
  }
  for (uVar8 = 0; uVar8 < pScene->mNumCameras; uVar8 = uVar8 + 1) {
    std::__cxx11::string::string
              ((string *)local_438,(pScene->mCameras[uVar8]->mName).data,(allocator *)&local_5b0);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,local_438);
    std::__cxx11::string::~string((string *)local_438);
  }
  for (uVar8 = 0; uVar8 < pScene->mNumLights; uVar8 = uVar8 + 1) {
    std::__cxx11::string::string
              ((string *)local_438,(pScene->mLights[uVar8]->mName).data,(allocator *)&local_5b0);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,local_438);
    std::__cxx11::string::~string((string *)local_438);
  }
  this_01 = (aiNode *)operator_new(0x478);
  std::__cxx11::string::string((string *)local_438,"$Reserved_And_Evil",(allocator *)&local_5b0);
  aiNode::aiNode(this_01,local_438);
  std::__cxx11::string::~string((string *)local_438);
  __dest_00 = (this_01->mName).data;
  std::__cxx11::string::string((string *)local_438,__dest_00,(allocator *)&local_5b0);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,local_438);
  std::__cxx11::string::~string((string *)local_438);
  paVar2 = pScene->mRootNode;
  uVar1 = (paVar2->mName).length;
  uVar4 = 0x3ff;
  if (uVar1 < 0x3ff) {
    uVar4 = uVar1;
  }
  uVar8 = (ulong)uVar4;
  __dest = (void *)((long)&local_438[0]._M_dataplus._M_p + 4);
  memcpy(__dest,(paVar2->mName).data,uVar8);
  *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + uVar8 + 4) = 0;
  paVar2->mParent = this_01;
  this_01->mNumChildren = 1;
  ppaVar7 = (aiNode **)operator_new__(8);
  this_01->mChildren = ppaVar7;
  *ppaVar7 = pScene->mRootNode;
  nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&nodes;
  nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size = 0;
  nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.super__List_node_base.
  _M_prev = nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
            super__List_node_base._M_next;
  CollectNewChildren(this,this_01,
                     (list<aiNode_*,_std::allocator<aiNode_*>_> *)
                     nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node.
                     super__List_node_base._M_next);
  if (nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl._M_node._M_size == 1) {
    if (this_01->mNumChildren == 1) {
      ppaVar7 = this_01->mChildren;
      pScene->mRootNode = *ppaVar7;
      *ppaVar7 = (aiNode *)0x0;
      aiNode::~aiNode(this_01);
      operator_delete(this_01);
      this_01 = pScene->mRootNode;
    }
    else {
      if (this_01->mNumChildren == 0) {
        pScene->mRootNode = (aiNode *)0x0;
        this_03 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&local_5b0,"After optimizing the scene graph, no data remains",
                   (allocator *)local_5d0);
        DeadlyImportError::DeadlyImportError(this_03,(string *)&local_5b0);
        __cxa_throw(this_03,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      pScene->mRootNode = this_01;
      (this_01->mName).length = uVar4;
      memcpy(__dest_00,__dest,uVar8);
      (this_01->mName).data[uVar8] = '\0';
    }
    this_01->mParent = (aiNode *)0x0;
    bVar5 = DefaultLogger::isNullLogger();
    if (!bVar5) {
      if (this->nodes_in == this->nodes_out) {
        pLVar6 = DefaultLogger::get();
        Logger::debug(pLVar6,"OptimizeGraphProcess finished");
      }
      else {
        pLVar6 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[45]>
                  (&local_5b0,(char (*) [45])"OptimizeGraphProcess finished; Input nodes: ");
        this_02 = (ostream *)
                  Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                  operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_5b0,&this->nodes_in);
        std::operator<<(this_02,", Output nodes: ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)this_02,
                   &this->nodes_out);
        std::__cxx11::stringbuf::str();
        Logger::info(pLVar6,local_5d0[0]);
        std::__cxx11::string::~string((string *)local_5d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5b0);
      }
    }
    puVar3 = (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&this_00->_M_t);
    std::__cxx11::_List_base<aiNode_*,_std::allocator<aiNode_*>_>::_M_clear
              (&nodes.super__List_base<aiNode_*,_std::allocator<aiNode_*>_>);
    return;
  }
  __assert_fail("nodes.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/OptimizeGraph.cpp"
                ,0x131,"virtual void Assimp::OptimizeGraphProcess::Execute(aiScene *)");
}

Assistant:

void OptimizeGraphProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("OptimizeGraphProcess begin");
    nodes_in = nodes_out = count_merged = 0;
    mScene = pScene;

    meshes.resize(pScene->mNumMeshes,0);
    FindInstancedMeshes(pScene->mRootNode);

    // build a blacklist of identifiers. If the name of a node matches one of these, we won't touch it
    locked.clear();
    for (std::list<std::string>::const_iterator it = locked_nodes.begin(); it != locked_nodes.end(); ++it) {
#ifdef AI_OG_USE_HASHING
        locked.insert(SuperFastHash((*it).c_str()));
#else
        locked.insert(*it);
#endif
    }

    for (unsigned int i = 0; i < pScene->mNumAnimations; ++i) {
        for (unsigned int a = 0; a < pScene->mAnimations[i]->mNumChannels; ++a) {
            aiNodeAnim* anim = pScene->mAnimations[i]->mChannels[a];
            locked.insert(AI_OG_GETKEY(anim->mNodeName));
        }
    }

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        for (unsigned int a = 0; a < pScene->mMeshes[i]->mNumBones; ++a) {

            aiBone* bone = pScene->mMeshes[i]->mBones[a];
            locked.insert(AI_OG_GETKEY(bone->mName));

            // HACK: Meshes referencing bones may not be transformed; we need to look them.
            // The easiest way to do this is to increase their reference counters ...
            meshes[i] += 2;
        }
    }

    for (unsigned int i = 0; i < pScene->mNumCameras; ++i) {
        aiCamera* cam = pScene->mCameras[i];
        locked.insert(AI_OG_GETKEY(cam->mName));
    }

    for (unsigned int i = 0; i < pScene->mNumLights; ++i) {
        aiLight* lgh = pScene->mLights[i];
        locked.insert(AI_OG_GETKEY(lgh->mName));
    }

    // Insert a dummy master node and make it read-only
    aiNode* dummy_root = new aiNode(AI_RESERVED_NODE_NAME);
    locked.insert(AI_OG_GETKEY(dummy_root->mName));

    const aiString prev = pScene->mRootNode->mName;
    pScene->mRootNode->mParent = dummy_root;

    dummy_root->mChildren = new aiNode*[dummy_root->mNumChildren = 1];
    dummy_root->mChildren[0] = pScene->mRootNode;

    // Do our recursive processing of scenegraph nodes. For each node collect
    // a fully new list of children and allow their children to place themselves
    // on the same hierarchy layer as their parents.
    std::list<aiNode*> nodes;
    CollectNewChildren (dummy_root,nodes);

    ai_assert(nodes.size() == 1);

    if (dummy_root->mNumChildren == 0) {
        pScene->mRootNode = NULL;
        throw DeadlyImportError("After optimizing the scene graph, no data remains");
    }

    if (dummy_root->mNumChildren > 1) {
        pScene->mRootNode = dummy_root;

        // Keep the dummy node but assign the name of the old root node to it
        pScene->mRootNode->mName = prev;
    }
    else {

        // Remove the dummy root node again.
        pScene->mRootNode = dummy_root->mChildren[0];

        dummy_root->mChildren[0] = NULL;
        delete dummy_root;
    }

    pScene->mRootNode->mParent = NULL;
    if (!DefaultLogger::isNullLogger()) {
        if ( nodes_in != nodes_out) {
            ASSIMP_LOG_INFO_F("OptimizeGraphProcess finished; Input nodes: ", nodes_in, ", Output nodes: ", nodes_out);
        } else {
            ASSIMP_LOG_DEBUG("OptimizeGraphProcess finished");
        }
    }
    meshes.clear();
    locked.clear();
}